

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perftest.c
# Opt level: O3

int run(int validate_utf8)

{
  long *plVar1;
  char **ppcVar2;
  int iVar3;
  yajl_status yVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  yajl_handle h;
  char **ppcVar8;
  size_t jsonTextLen;
  undefined8 *puVar9;
  long lVar10;
  uchar *jsonText;
  double dVar11;
  double dVar12;
  timeval now;
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  dVar11 = (double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec;
  lVar10 = 0;
  do {
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    dVar12 = ((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - dVar11;
    if (3.0 <= dVar12) break;
    iVar5 = (int)lVar10;
    do {
      h = yajl_alloc((yajl_callbacks *)0x0,(yajl_alloc_funcs *)0x0,(void *)0x0);
      yajl_config(h,yajl_dont_validate_strings,(ulong)(validate_utf8 == 0));
      iVar3 = num_docs();
      ppcVar8 = get_doc((int)(lVar10 % (long)iVar3));
      jsonText = (uchar *)*ppcVar8;
      while (jsonText != (uchar *)0x0) {
        jsonTextLen = strlen((char *)jsonText);
        yVar4 = yajl_parse(h,jsonText,jsonTextLen);
        if (yVar4 != yajl_status_ok) break;
        ppcVar2 = ppcVar8 + 1;
        ppcVar8 = ppcVar8 + 1;
        jsonText = (uchar *)*ppcVar2;
      }
      yVar4 = yajl_complete_parse(h);
      if (yVar4 != yajl_status_ok) {
        run_cold_1();
        return 1;
      }
      yajl_free(h);
      lVar10 = lVar10 + 1;
    } while (iVar5 + 100 != (int)lVar10);
  } while (dVar12 < 3.0);
  iVar3 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  iVar5 = num_docs();
  if (0 < iVar5) {
    iVar3 = 0;
    iVar5 = 0;
    do {
      uVar6 = doc_size(iVar5);
      iVar3 = iVar3 + uVar6;
      iVar5 = iVar5 + 1;
      iVar7 = num_docs();
    } while (iVar5 < iVar7);
  }
  iVar5 = num_docs();
  dVar11 = (double)(lVar10 * (iVar3 / iVar5)) /
           (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - dVar11);
  puVar9 = &DAT_0011cdc0;
  do {
    if (dVar11 <= 1024.0) break;
    dVar11 = dVar11 * 0.0009765625;
    plVar1 = puVar9 + 2;
    puVar9 = puVar9 + 1;
  } while (*plVar1 != 0);
  printf("Parsing speed: %g %s\n",*puVar9,(long)iVar3 % (long)iVar5 & 0xffffffff);
  return 0;
}

Assistant:

static int
run(int validate_utf8)
{
    long long times = 0; 
    double starttime;

    starttime = mygettime();

    /* allocate a parser */
    for (;;) {
		int i;
        {
            double now = mygettime();
            if (now - starttime >= PARSE_TIME_SECS) break;
        }

        for (i = 0; i < 100; i++) {
            yajl_handle hand = yajl_alloc(NULL, NULL, NULL);
            yajl_status stat;        
            const char ** d;

            yajl_config(hand, yajl_dont_validate_strings, validate_utf8 ? 0 : 1);

            for (d = get_doc(times % num_docs()); *d; d++) {
                stat = yajl_parse(hand, (unsigned char *) *d, strlen(*d));
                if (stat != yajl_status_ok) break;
            }
            
            stat = yajl_complete_parse(hand);

            if (stat != yajl_status_ok) {
                unsigned char * str =
                    yajl_get_error(hand, 1,
                                   (unsigned char *) *d,
                                   (*d ? strlen(*d) : 0));
                fprintf(stderr, "%s", (const char *) str);
                yajl_free_error(hand, str);
                return 1;
            }
            yajl_free(hand);
            times++;
        }
    }

    /* parsed doc 'times' times */
    {
        double throughput;
        double now;
        const char * all_units[] = { "B/s", "KB/s", "MB/s", (char *) 0 };
        const char ** units = all_units;
        int i, avg_doc_size = 0;

        now = mygettime();

        for (i = 0; i < num_docs(); i++) avg_doc_size += doc_size(i);
        avg_doc_size /= num_docs();

        throughput = (times * avg_doc_size) / (now - starttime);
        
        while (*(units + 1) && throughput > 1024) {
            throughput /= 1024;
            units++;
        }
        
        printf("Parsing speed: %g %s\n", throughput, *units);
    }

    return 0;
}